

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O2

void __thiscall basist::ktx2_transcoder_state::clear(ktx2_transcoder_state *this)

{
  basisu_transcoder_state::clear(&this->m_transcoder_state);
  basisu::vector<unsigned_char>::clear(&this->m_level_uncomp_data);
  this->m_uncomp_data_level_index = -1;
  return;
}

Assistant:

void clear()
		{
			m_transcoder_state.clear();
			m_level_uncomp_data.clear();
			m_uncomp_data_level_index = -1;
		}